

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O0

void DrawLineEx(Vector2 startPos,Vector2 endPos,float thick,Color color)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Vector2 local_58;
  Vector2 strip [4];
  Vector2 radius;
  float scale;
  float length;
  Vector2 delta;
  float thick_local;
  Color color_local;
  Vector2 endPos_local;
  Vector2 startPos_local;
  
  thick_local = endPos.x;
  endPos_local.x = startPos.x;
  fVar1 = thick_local - endPos_local.x;
  color_local = (Color)endPos.y;
  endPos_local.y = startPos.y;
  fVar2 = (float)color_local - endPos_local.y;
  fVar3 = sqrtf(fVar1 * fVar1 + fVar2 * fVar2);
  if ((0.0 < fVar3) && (0.0 < thick)) {
    fVar3 = thick / (fVar3 * 2.0);
    strip[3].x = -fVar3 * fVar2;
    strip[3].y = fVar3 * fVar1;
    local_58.x = endPos_local.x - strip[3].x;
    local_58.y = endPos_local.y - strip[3].y;
    strip[0].x = endPos_local.x + strip[3].x;
    strip[0].y = endPos_local.y + strip[3].y;
    strip[1].x = thick_local - strip[3].x;
    strip[1].y = (float)color_local - strip[3].y;
    strip[2].x = thick_local + strip[3].x;
    strip[2].y = (float)color_local + strip[3].y;
    DrawTriangleStrip(&local_58,4,color);
  }
  return;
}

Assistant:

void DrawLineEx(Vector2 startPos, Vector2 endPos, float thick, Color color)
{
    Vector2 delta = {endPos.x-startPos.x, endPos.y-startPos.y};
    float   length = sqrtf(delta.x*delta.x + delta.y*delta.y);

    if (length > 0  &&  thick > 0)
    {
        float   scale = thick/(2*length);
        Vector2 radius = {-scale*delta.y, scale*delta.x};
        Vector2 strip[] = {{startPos.x-radius.x, startPos.y-radius.y}, {startPos.x+radius.x, startPos.y+radius.y},
                           {endPos.x-radius.x, endPos.y-radius.y}, {endPos.x+radius.x, endPos.y+radius.y}};

        DrawTriangleStrip(strip, 4, color);
    }
}